

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurredsegment.cpp
# Opt level: O0

Pt2i __thiscall BlurredSegment::getMiddle(BlurredSegment *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 local_28 [8];
  Pt2i lp;
  Pt2i rp;
  BlurredSegment *this_local;
  
  BiPtList::backPoint((BiPtList *)&lp);
  BiPtList::frontPoint((BiPtList *)local_28);
  iVar1 = Pt2i::x(&lp);
  iVar2 = Pt2i::x((Pt2i *)local_28);
  iVar3 = Pt2i::y(&lp);
  iVar4 = Pt2i::y((Pt2i *)local_28);
  Pt2i::Pt2i((Pt2i *)this,(iVar1 + iVar2) / 2,(iVar3 + iVar4) / 2);
  Pt2i::~Pt2i((Pt2i *)local_28);
  Pt2i::~Pt2i(&lp);
  return (Pt2i)this;
}

Assistant:

const Pt2i BlurredSegment::getMiddle () const
{
  Pt2i rp = plist->backPoint ();
  Pt2i lp = plist->frontPoint ();
  return (Pt2i ((rp.x () + lp.x ()) / 2, (rp.y () + lp.y ()) / 2));
}